

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

bool duckdb::Linenoise::IsSpace(char c)

{
  int iVar1;
  char c_local;
  bool local_1;
  
  iVar1 = (int)c;
  if (((iVar1 - 9U < 2) || (iVar1 == 0xd)) || (iVar1 == 0x20)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Linenoise::IsSpace(char c) {
	switch (c) {
	case ' ':
	case '\r':
	case '\n':
	case '\t':
		return true;
	default:
		return false;
	}
}